

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O2

iter_type __thiscall
booster::locale::util::base_num_format<char>::do_real_put<long_long>
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,longlong val)

{
  iter_type iVar1;
  ios_info *this_00;
  uint64_t uVar2;
  streambuf_type *psVar3;
  uint uVar4;
  undefined4 uVar5;
  bool bVar6;
  iter_type iVar7;
  iter_type iVar9;
  iter_type __s;
  iter_type out_00;
  sstream_type ss;
  char c;
  locale local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  iter_type iVar8;
  
  iVar8._M_sbuf = out._M_sbuf;
  uVar4 = out._8_4_;
  this_00 = ios_info::get(ios);
  uVar2 = ios_info::display_flags(this_00);
  switch(uVar2) {
  case 0:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::locale::classic();
    std::ios::imbue(&local_1b0);
    std::locale::~locale(&local_1b0);
    *(undefined4 *)
     ((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
         *(undefined4 *)(ios + 0x18);
    *(undefined8 *)
     ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
         *(undefined8 *)(ios + 8);
    *(undefined8 *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18))
         = *(undefined8 *)(ios + 0x10);
    iVar8._8_4_ = uVar4 & 0xff;
    iVar8._12_4_ = 0;
    iVar8 = std::num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>::
            _M_insert_int<long_long>
                      (&this->
                        super_num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>
                       ,iVar8,(ios_base *)
                              ((long)&local_1a8[0]._M_dataplus._M_p +
                              *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)),fill,val);
    psVar3 = iVar8._M_sbuf;
    uVar5 = iVar8._8_4_;
    *(undefined8 *)(ios + 0x10) = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    goto LAB_001a2f29;
  default:
    __s._8_4_ = uVar4 & 0xff;
    __s._M_sbuf = iVar8._M_sbuf;
    __s._12_4_ = 0;
    iVar8 = std::num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>::
            _M_insert_int<long_long>
                      (&this->
                        super_num_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_>
                       ,__s,ios,fill,val);
    iVar9._M_sbuf = iVar8._M_sbuf;
    iVar9._M_failed = iVar8._M_failed;
    iVar9._9_7_ = iVar8._9_7_;
    return iVar9;
  case 2:
    uVar2 = ios_info::currency_flags(this_00);
    if (uVar2 == 0) {
      bVar6 = false;
    }
    else {
      uVar2 = ios_info::currency_flags(this_00);
      bVar6 = uVar2 != 0x40;
    }
    iVar7 = (iter_type)
            (**(code **)(*(long *)this + 0x50))
                      (this,bVar6,iVar8._M_sbuf,uVar4 & 0xff,ios,(int)fill,(longdouble)val);
    return iVar7;
  case 4:
    c = 'x';
    break;
  case 5:
    c = 'X';
    break;
  case 6:
    c = 'c';
    break;
  case 7:
    ios_info::date_time_pattern<char>(local_1a8,this_00);
    iVar7._8_4_ = uVar4 & 0xff;
    iVar7._M_sbuf = iVar8._M_sbuf;
    iVar7._12_4_ = 0;
    iVar7 = format_time(this,iVar7,ios,fill,val,local_1a8);
    psVar3 = iVar7._M_sbuf;
    uVar5 = iVar7._8_4_;
    std::__cxx11::string::~string((string *)local_1a8);
LAB_001a2f29:
    iVar1._8_4_ = uVar5;
    iVar1._M_sbuf = psVar3;
    iVar1._12_4_ = 0;
    return iVar1;
  }
  out_00._8_4_ = uVar4 & 0xff;
  out_00._M_sbuf = iVar8._M_sbuf;
  out_00._12_4_ = 0;
  iVar7 = format_time(this,out_00,ios,fill,val,c);
  return iVar7;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        typedef std::num_put<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                typedef std::basic_ostringstream<char_type> sstream_type;
                sstream_type ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                ss.width(ios.width());
                iter_type ret_ptr = super::do_put(out,ss,fill,val);
                ios.width(0);
                return ret_ptr;
            }
        case flags::date:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'x');
        case flags::time:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'X');
        case flags::datetime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'c');
        case flags::strftime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),info.date_time_pattern<char_type>());
        case flags::currency:
            {
                bool nat =  info.currency_flags()==flags::currency_default 
                            || info.currency_flags() == flags::currency_national;
                bool intl = !nat;
                return do_format_currency(intl,out,ios,fill,static_cast<long double>(val));
            }

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_put(out,ios,fill,val);
        }
    }